

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::replace_path_prefix
               (SmallVectorImpl<char> *Path,StringRef *OldPrefix,StringRef *NewPrefix,Style style)

{
  void *__s1;
  Style SVar1;
  iterator __first;
  iterator __last;
  unsigned_long *puVar2;
  long lVar3;
  bool bVar4;
  Twine local_2f8;
  Twine local_2e0;
  Twine local_2c8;
  Twine local_2b0;
  Twine local_298;
  Twine local_280;
  Twine local_268;
  Twine local_250;
  undefined1 local_238 [8];
  SmallString<256U> NewPath;
  StringRef RelPath;
  void *local_108;
  StringRef OrigPath;
  Style style_local;
  StringRef *NewPrefix_local;
  StringRef *OldPrefix_local;
  SmallVectorImpl<char> *Path_local;
  unsigned_long local_c0 [2];
  size_t local_b0;
  void **local_a8;
  undefined1 local_a0 [16];
  StringRef *local_90;
  StringRef *local_88;
  SmallVectorImpl<char> *local_80;
  SmallVectorImpl<char> *local_78;
  unsigned_long local_70;
  long local_68;
  undefined1 *local_60;
  char *local_58;
  void *local_50;
  void **local_48;
  void **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  void *local_18;
  int local_c;
  
  if ((OldPrefix->Length != 0) || (local_90 = NewPrefix, NewPrefix->Length != 0)) {
    __s1 = (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    OrigPath.Length._4_4_ = style;
    local_88 = OldPrefix;
    local_78 = Path;
    local_58 = (char *)SmallVectorBase::size((SmallVectorBase *)Path);
    local_48 = &local_108;
    local_38 = OldPrefix->Data;
    local_30 = (char *)OldPrefix->Length;
    local_40 = &local_108;
    bVar4 = false;
    local_50 = __s1;
    local_108 = __s1;
    OrigPath.Data = local_58;
    if (local_30 <= local_58) {
      local_28 = local_30;
      local_20 = local_38;
      local_18 = __s1;
      if (local_30 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(__s1,local_38,(size_t)local_30);
      }
      bVar4 = local_c == 0;
    }
    if (bVar4) {
      if (OldPrefix->Length == NewPrefix->Length) {
        __first = StringRef::begin(NewPrefix);
        __last = StringRef::end(NewPrefix);
        local_80 = Path;
        std::copy<char_const*,char*>
                  (__first,__last,
                   (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
        ;
      }
      else {
        local_b0 = OldPrefix->Length;
        local_a8 = &local_108;
        local_c0[1] = 0xffffffffffffffff;
        puVar2 = std::min<unsigned_long>(&local_b0,(unsigned_long *)&OrigPath);
        local_b0 = *puVar2;
        lVar3 = (long)local_108 + local_b0;
        local_c0[0] = (long)OrigPath.Data - local_b0;
        puVar2 = std::min<unsigned_long>(local_c0 + 1,local_c0);
        local_70 = *puVar2;
        local_60 = local_a0;
        NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
        _248_8_ = lVar3;
        local_68 = lVar3;
        SmallString<256U>::SmallString((SmallString<256U> *)local_238);
        SVar1 = OrigPath.Length._4_4_;
        Twine::Twine(&local_250,NewPrefix);
        Twine::Twine(&local_268,"");
        Twine::Twine(&local_280,"");
        Twine::Twine(&local_298,"");
        append((SmallVectorImpl<char> *)local_238,SVar1,&local_250,&local_268,&local_280,&local_298)
        ;
        SVar1 = OrigPath.Length._4_4_;
        Twine::Twine(&local_2b0,
                     (StringRef *)
                     (NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                      InlineElts + 0xf8));
        Twine::Twine(&local_2c8,"");
        Twine::Twine(&local_2e0,"");
        Twine::Twine(&local_2f8,"");
        append((SmallVectorImpl<char> *)local_238,SVar1,&local_2b0,&local_2c8,&local_2e0,&local_2f8)
        ;
        SmallVectorImpl<char>::swap(Path,(SmallVectorImpl<char> *)local_238);
        SmallString<256U>::~SmallString((SmallString<256U> *)local_238);
      }
    }
  }
  return;
}

Assistant:

void replace_path_prefix(SmallVectorImpl<char> &Path,
                         const StringRef &OldPrefix, const StringRef &NewPrefix,
                         Style style) {
  if (OldPrefix.empty() && NewPrefix.empty())
    return;

  StringRef OrigPath(Path.begin(), Path.size());
  if (!OrigPath.startswith(OldPrefix))
    return;

  // If prefixes have the same size we can simply copy the new one over.
  if (OldPrefix.size() == NewPrefix.size()) {
    std::copy(NewPrefix.begin(), NewPrefix.end(), Path.begin());
    return;
  }

  StringRef RelPath = OrigPath.substr(OldPrefix.size());
  SmallString<256> NewPath;
  path::append(NewPath, style, NewPrefix);
  path::append(NewPath, style, RelPath);
  Path.swap(NewPath);
}